

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkMakeOnePo(Abc_Ntk_t *pNtkInit,int Output,int nRange)

{
  Abc_Obj_t *pObj;
  void *pvVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  ulong uVar8;
  char *__s;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  
  if (pNtkInit->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtkInit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                  ,0x675,"Abc_Ntk_t *Abc_NtkMakeOnePo(Abc_Ntk_t *, int, int)");
  }
  if (pNtkInit->nObjCounts[8] != pNtkInit->vBoxes->nSize) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtkInit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                  ,0x676,"Abc_Ntk_t *Abc_NtkMakeOnePo(Abc_Ntk_t *, int, int)");
  }
  if ((Output < 0) || (pNtkInit->vPos->nSize <= Output)) {
    puts("PO index is incorrect.");
    pNtk = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk = Abc_NtkDup(pNtkInit);
    pVVar9 = pNtk->vPos;
    uVar13 = pVVar9->nSize;
    if (uVar13 != 1) {
      pVVar3 = (Vec_Ptr_t *)malloc(0x10);
      uVar12 = 8;
      if (8 < nRange) {
        uVar12 = (ulong)(uint)nRange;
      }
      pVVar3->nSize = 0;
      pVVar3->nCap = (int)uVar12;
      ppvVar4 = (void **)malloc(uVar12 * 8);
      pVVar3->pArray = ppvVar4;
      if ((int)uVar13 < 1) {
        iVar2 = 0;
      }
      else {
        iVar11 = 1;
        if (1 < nRange) {
          iVar11 = nRange;
        }
        iVar2 = 0;
        uVar8 = 0;
        do {
          pObj = (Abc_Obj_t *)pVVar9->pArray[uVar8];
          if ((uVar8 < (uint)Output) || ((uint)(iVar11 + Output) <= uVar8)) {
            Abc_NtkDeleteObjPo(pObj);
          }
          else {
            iVar10 = (int)uVar12;
            if (iVar2 == iVar10) {
              if (iVar10 < 0x10) {
                if (pVVar3->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
                }
                pVVar3->pArray = ppvVar4;
                pVVar3->nCap = 0x10;
                uVar12 = 0x10;
              }
              else {
                uVar12 = (ulong)(uint)(iVar10 * 2);
                if (pVVar3->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(uVar12 * 8);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar3->pArray,uVar12 * 8);
                }
                pVVar3->pArray = ppvVar4;
                pVVar3->nCap = iVar10 * 2;
              }
            }
            else {
              ppvVar4 = pVVar3->pArray;
            }
            lVar7 = (long)iVar2;
            iVar2 = iVar2 + 1;
            pVVar3->nSize = iVar2;
            ppvVar4[lVar7] = pObj;
          }
          uVar8 = uVar8 + 1;
          pVVar9 = pNtk->vPos;
          uVar13 = pVVar9->nSize;
        } while ((long)uVar8 < (long)(int)uVar13);
      }
      pVVar5 = (Vec_Ptr_t *)malloc(0x10);
      pVVar5->nSize = iVar2;
      iVar11 = (int)uVar12;
      pVVar5->nCap = iVar11;
      if (iVar11 == 0) {
        ppvVar4 = (void **)0x0;
      }
      else {
        ppvVar4 = (void **)malloc((long)iVar11 << 3);
      }
      pVVar5->pArray = ppvVar4;
      memcpy(ppvVar4,pVVar3->pArray,(long)iVar2 * 8);
      pVVar6 = pNtk->vCos;
      if ((int)uVar13 < pVVar6->nSize) {
        uVar8 = (ulong)uVar13;
        lVar7 = (long)iVar2;
        do {
          if ((int)uVar13 < 0) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar1 = pVVar6->pArray[uVar8];
          iVar2 = (int)uVar12;
          if ((int)lVar7 == iVar2) {
            if (iVar2 < 0x10) {
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
              }
              pVVar5->pArray = ppvVar4;
              pVVar5->nCap = 0x10;
              uVar12 = 0x10;
            }
            else {
              uVar12 = (ulong)(uint)(iVar2 * 2);
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(uVar12 * 8);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar5->pArray,uVar12 * 8);
              }
              pVVar5->pArray = ppvVar4;
              pVVar5->nCap = iVar2 * 2;
            }
          }
          else {
            ppvVar4 = pVVar5->pArray;
          }
          pVVar5->nSize = (int)(lVar7 + 1);
          ppvVar4[lVar7] = pvVar1;
          uVar8 = uVar8 + 1;
          pVVar6 = pNtk->vCos;
          lVar7 = lVar7 + 1;
        } while ((int)uVar8 < pVVar6->nSize);
        pVVar9 = pNtk->vPos;
      }
      if (pVVar9->pArray != (void **)0x0) {
        free(pVVar9->pArray);
      }
      free(pVVar9);
      pNtk->vPos = pVVar3;
      pVVar9 = pNtk->vCos;
      ppvVar4 = pVVar9->pArray;
      if (ppvVar4 != (void **)0x0) {
        free(ppvVar4);
      }
      free(pVVar9);
      pNtk->vCos = pVVar5;
      if (pNtk->ntkType == ABC_NTK_STRASH) {
        Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
        __s = "Run sequential cleanup (\"scl\") to get rid of dangling logic.";
      }
      else {
        __s = "Run sequential cleanup (\"st; scl\") to get rid of dangling logic.";
      }
      puts(__s);
      iVar2 = Abc_NtkCheck(pNtk);
      if (iVar2 == 0) {
        fwrite("Abc_NtkMakeComb(): Network check has failed.\n",0x2d,1,_stdout);
      }
    }
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkMakeOnePo( Abc_Ntk_t * pNtkInit, int Output, int nRange )
{
    Abc_Ntk_t * pNtk;
    Vec_Ptr_t * vPosLeft;
    Vec_Ptr_t * vCosLeft;
    Abc_Obj_t * pNodePo;
    int i;
    assert( !Abc_NtkIsNetlist(pNtkInit) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtkInit) );
    if ( Output < 0 || Output >= Abc_NtkPoNum(pNtkInit) )
    {
        printf( "PO index is incorrect.\n" );
        return NULL;
    }

    pNtk = Abc_NtkDup( pNtkInit );
    if ( Abc_NtkPoNum(pNtk) == 1 )
        return pNtk;

    if ( nRange < 1 )
        nRange = 1;

    // filter POs
    vPosLeft = Vec_PtrAlloc( nRange );
    Abc_NtkForEachPo( pNtk, pNodePo, i )
        if ( i < Output || i >= Output + nRange )
            Abc_NtkDeleteObjPo( pNodePo );
        else
            Vec_PtrPush( vPosLeft, pNodePo );
    // filter COs
    vCosLeft = Vec_PtrDup( vPosLeft );
    for ( i = Abc_NtkPoNum(pNtk); i < Abc_NtkCoNum(pNtk); i++ )
        Vec_PtrPush( vCosLeft, Abc_NtkCo(pNtk, i) );
    // update arrays
    Vec_PtrFree( pNtk->vPos );  pNtk->vPos = vPosLeft;
    Vec_PtrFree( pNtk->vCos );  pNtk->vCos = vCosLeft;

    // clean the network
    if ( Abc_NtkIsStrash(pNtk) )
    {
        Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
        printf( "Run sequential cleanup (\"scl\") to get rid of dangling logic.\n" );
    }
    else
    {
        printf( "Run sequential cleanup (\"st; scl\") to get rid of dangling logic.\n" );
    }

    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkMakeComb(): Network check has failed.\n" );
    return pNtk;
}